

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall VM::pop<int>(VM *this,int *out)

{
  StackFrame *this_00;
  
  this_00 = (this->stack).super__Vector_base<StackFrame_*,_std::allocator<StackFrame_*>_>._M_impl.
            super__Vector_impl_data._M_finish[-1];
  rmstack(this);
  *out = *(int *)this_00->ptr;
  StackFrame::~StackFrame(this_00);
  operator_delete(this_00);
  return;
}

Assistant:

void pop(T& out) {
    StackFrame* frame = stack.back();
    rmstack();
    memcpy(&out,frame->ptr,sizeof(T));
    delete frame;
  }